

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O1

int CVodeSetEpsProj(void *cvode_mem,sunrealtype eps)

{
  int iVar1;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  CVodeProjMem local_20;
  double local_18;
  CVodeMem local_8;
  
  local_18 = eps;
  iVar1 = cvAccessProjMem(cvode_mem,"CVodeSetEpsProj",&local_8,&local_20);
  if (iVar1 == 0) {
    local_20->eps_proj =
         (sunrealtype)
         (~-(ulong)(0.0 < local_18) & 0x3fb999999999999a |
         (ulong)local_18 & -(ulong)(0.0 < local_18));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetEpsProj(void* cvode_mem, sunrealtype eps)
{
  int retval;
  CVodeMem cv_mem;
  CVodeProjMem proj_mem;

  /* Access memory structures */
  retval = cvAccessProjMem(cvode_mem, __func__, &cv_mem, &proj_mem);
  if (retval != CV_SUCCESS) { return (retval); }

  /* Set the projection tolerance */
  if (eps <= ZERO)
  {
    /* Restore default */
    proj_mem->eps_proj = PROJ_EPS;
  }
  else
  {
    /* Update projection tolerance */
    proj_mem->eps_proj = eps;
  }

  return (CV_SUCCESS);
}